

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dom.hpp
# Opt level: O0

void __thiscall crawler::Node::Node(Node *this,string *str,shared_ptr<crawler::Node> *_parent)

{
  shared_ptr<crawler::Node> *_parent_local;
  string *str_local;
  Node *this_local;
  
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::vector(&this->children);
  this->nodeType = Text;
  std::variant<crawler::ElementData,std::__cxx11::string>::
  variant<std::__cxx11::string_const&,void,void,std::__cxx11::string,void>
            ((variant<crawler::ElementData,std::__cxx11::string> *)&this->nodeData,str);
  std::shared_ptr<crawler::Node>::shared_ptr(&this->parent,_parent);
  return;
}

Assistant:

explicit Node(const std::string &str, std::shared_ptr<Node> _parent)
      : nodeType(NodeType::Text), nodeData(str), parent(std::move(_parent)) {}